

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

ExecutionReport *
anon_unknown.dwarf_52c65e::createExecutionReport
          (ExecutionReport *__return_storage_ptr__,char *sender,char *target,int seq)

{
  Message *header;
  string *psVar1;
  Message *this;
  int iVar2;
  ExecutionReport *pEVar3;
  undefined1 local_430 [16];
  _Alloc_hider local_420;
  char local_410 [16];
  _Alloc_hider local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  field_metrics local_3e0;
  Message *local_3d8;
  FieldBase local_3d0;
  long *local_378;
  long local_370;
  long local_368 [2];
  Message *local_358;
  long *local_350;
  long local_348;
  long local_340 [2];
  long *local_330;
  long local_328;
  long local_320 [2];
  NoContraBrokers noContraBrokers;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  char local_278 [16];
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  field_metrics local_248;
  FieldBase local_240;
  FieldBase local_1e8;
  FieldBase local_190;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  local_3d8 = (Message *)__return_storage_ptr__;
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ID","");
  noContraBrokers.super_Group._0_8_ = &PTR__FieldBase_00320f80;
  noContraBrokers.super_Group._8_4_ = 0x25;
  noContraBrokers.super_Group._16_8_ = &noContraBrokers.super_Group.field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&noContraBrokers.super_Group.field_0x10,local_330,local_328 + (long)local_330
            );
  noContraBrokers.super_Group._48_8_ = &noContraBrokers.super_Group.field_0x40;
  noContraBrokers.super_Group._56_8_ = 0;
  noContraBrokers.super_Group._64_1_ = 0;
  noContraBrokers.super_Group._80_8_ = 0;
  noContraBrokers.super_Group._0_8_ = &PTR__FieldBase_00327b98;
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"ID","");
  local_430._0_8_ = &PTR__FieldBase_00320f80;
  local_430._8_4_ = 0x11;
  local_420._M_p = local_410;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_378,local_370 + (long)local_378);
  local_400._M_p = (pointer)&local_3f0;
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0.m_length = 0;
  local_3e0.m_checksum = 0;
  local_430._0_8_ = &PTR__FieldBase_00327bd0;
  FIX::CharField::CharField((CharField *)&local_3d0,0x14,'0');
  local_3d0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327c08;
  FIX::CharField::CharField((CharField *)&local_1e8,0x96,'0');
  local_1e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327c40;
  FIX::CharField::CharField((CharField *)&local_240,0x27,'0');
  local_240._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327c78;
  local_350 = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"SYMBOL","");
  local_298._0_8_ = &PTR__FieldBase_00320f80;
  local_298._8_4_ = 0x37;
  local_288._M_p = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_350,local_348 + (long)local_350);
  local_268._M_p = (pointer)&local_258;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_248.m_length = 0;
  local_248.m_checksum = 0;
  local_298._0_8_ = &PTR__FieldBase_00324f68;
  FIX::CharField::CharField((CharField *)&local_88,0x36,'1');
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327310;
  FIX::DoubleField::DoubleField((DoubleField *)&local_e0,0x97,100.0,0);
  local_e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327cb0;
  FIX::DoubleField::DoubleField((DoubleField *)&local_138,0xe,0.0,0);
  local_138._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327ce8;
  FIX::DoubleField::DoubleField((DoubleField *)&local_190,6,0.0,0);
  local_190._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327d20;
  FIX42::ExecutionReport::ExecutionReport
            ((ExecutionReport *)local_3d8,(OrderID *)&noContraBrokers,(ExecID *)local_430,
             (ExecTransType *)&local_3d0,(ExecType *)&local_1e8,(OrdStatus *)&local_240,
             (Symbol *)local_298,(Side *)&local_88,(LeavesQty *)&local_e0,(CumQty *)&local_138,
             (AvgPx *)&local_190);
  FIX::FieldBase::~FieldBase(&local_190);
  FIX::FieldBase::~FieldBase(&local_138);
  FIX::FieldBase::~FieldBase(&local_e0);
  FIX::FieldBase::~FieldBase(&local_88);
  FIX::FieldBase::~FieldBase((FieldBase *)local_298);
  if (local_350 != local_340) {
    operator_delete(local_350,local_340[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_240);
  FIX::FieldBase::~FieldBase(&local_1e8);
  FIX::FieldBase::~FieldBase(&local_3d0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&noContraBrokers);
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  this = local_3d8;
  header = local_3d8 + 0x70;
  fillHeader((Header *)header,"ISLD","TW",2);
  FIX42::ExecutionReport::NoContraBrokers::NoContraBrokers(&noContraBrokers);
  psVar1 = &local_3d0.m_string;
  local_3d0._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"BROKER","");
  local_430._0_8_ = &PTR__FieldBase_00320f80;
  local_430._8_4_ = 0x177;
  local_420._M_p = local_410;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_3d0._vptr_FieldBase,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_3d0._vptr_FieldBase)->_M_p + local_3d0._8_8_));
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0.m_length = 0;
  local_3e0.m_checksum = 0;
  local_430._0_8_ = &PTR__FieldBase_0032ab10;
  local_400._M_p = (pointer)&local_3f0;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  if ((string *)local_3d0._vptr_FieldBase != psVar1) {
    operator_delete(local_3d0._vptr_FieldBase,(ulong)(local_3d0.m_string._M_dataplus._M_p + 1));
  }
  local_3d0._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"TRADER","");
  local_430._0_8_ = &PTR__FieldBase_00320f80;
  local_430._8_4_ = 0x151;
  local_420._M_p = local_410;
  local_358 = header;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_3d0._vptr_FieldBase,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_3d0._vptr_FieldBase)->_M_p + local_3d0._8_8_));
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0.m_length = 0;
  local_3e0.m_checksum = 0;
  local_430._0_8_ = &PTR__FieldBase_0032ab48;
  local_400._M_p = (pointer)&local_3f0;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  if ((string *)local_3d0._vptr_FieldBase != psVar1) {
    operator_delete(local_3d0._vptr_FieldBase,(ulong)(local_3d0.m_string._M_dataplus._M_p + 1));
  }
  FIX::DoubleField::DoubleField((DoubleField *)local_430,0x1b5,100.0,0);
  local_430._0_8_ = &PTR__FieldBase_0032ab80;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  FIX::ContraTradeTime::now();
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  FIX::FieldMap::addGroup
            ((int)this,(FieldMap *)(ulong)(uint)noContraBrokers.super_Group.m_field,
             SUB81(&noContraBrokers,0));
  local_3d0._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"BROKER2","");
  local_430._0_8_ = &PTR__FieldBase_00320f80;
  local_430._8_4_ = 0x177;
  local_420._M_p = local_410;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_3d0._vptr_FieldBase,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_3d0._vptr_FieldBase)->_M_p + local_3d0._8_8_));
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0.m_length = 0;
  local_3e0.m_checksum = 0;
  local_430._0_8_ = &PTR__FieldBase_0032ab10;
  local_400._M_p = (pointer)&local_3f0;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  if ((string *)local_3d0._vptr_FieldBase != psVar1) {
    operator_delete(local_3d0._vptr_FieldBase,(ulong)(local_3d0.m_string._M_dataplus._M_p + 1));
  }
  local_3d0._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"TRADER2","");
  local_430._0_8_ = &PTR__FieldBase_00320f80;
  local_430._8_4_ = 0x151;
  local_420._M_p = local_410;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_3d0._vptr_FieldBase,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_3d0._vptr_FieldBase)->_M_p + local_3d0._8_8_));
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0.m_length = 0;
  local_3e0.m_checksum = 0;
  local_430._0_8_ = &PTR__FieldBase_0032ab48;
  local_400._M_p = (pointer)&local_3f0;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  if ((string *)local_3d0._vptr_FieldBase != psVar1) {
    operator_delete(local_3d0._vptr_FieldBase,(ulong)(local_3d0.m_string._M_dataplus._M_p + 1));
  }
  FIX::DoubleField::DoubleField((DoubleField *)local_430,0x1b5,100.0,0);
  local_430._0_8_ = &PTR__FieldBase_0032ab80;
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  FIX::ContraTradeTime::now();
  FIX::FieldMap::setField((FieldMap *)&noContraBrokers,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  FIX::FieldMap::addGroup
            ((int)this,(FieldMap *)(ulong)(uint)noContraBrokers.super_Group.m_field,
             SUB81(&noContraBrokers,0));
  iVar2 = FIX::Message::bodyLength(this,8,9,10);
  FIX::IntField::IntField((IntField *)local_430,9,iVar2);
  local_430._0_8_ = &PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)local_358,(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  iVar2 = FIX::Message::checkSum(this,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)local_430,10,iVar2);
  local_430._0_8_ = &PTR__FieldBase_00325560;
  FIX::FieldMap::setField((FieldMap *)(this + 0xe0),(FieldBase *)local_430,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_430);
  pEVar3 = (ExecutionReport *)FIX::FieldMap::~FieldMap((FieldMap *)&noContraBrokers);
  return pEVar3;
}

Assistant:

FIX42::ExecutionReport createExecutionReport(const char *sender, const char *target, int seq) {
  FIX42::ExecutionReport executionReport(
      OrderID("ID"),
      ExecID("ID"),
      ExecTransType('0'),
      ExecType('0'),
      OrdStatus('0'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      LeavesQty(100),
      CumQty(0),
      AvgPx(0));
  fillHeader(executionReport.getHeader(), sender, target, seq);
  FIX42::ExecutionReport::NoContraBrokers noContraBrokers;
  noContraBrokers.set(ContraBroker("BROKER"));
  noContraBrokers.set(ContraTrader("TRADER"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  noContraBrokers.set(ContraBroker("BROKER2"));
  noContraBrokers.set(ContraTrader("TRADER2"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  executionReport.getHeader().setField(BodyLength(executionReport.bodyLength()));
  executionReport.getTrailer().setField(CheckSum(executionReport.checkSum()));
  return executionReport;
}